

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.c
# Opt level: O2

int wally_ec_private_key_verify(uchar *priv_key,size_t priv_key_len)

{
  int iVar1;
  secp256k1_context_struct *ctx;
  
  ctx = secp_ctx();
  if (ctx == (secp256k1_context_struct *)0x0) {
    iVar1 = -3;
  }
  else if (priv_key_len == 0x20 && priv_key != (uchar *)0x0) {
    iVar1 = secp256k1_ec_seckey_verify(ctx,priv_key);
    iVar1 = (uint)(iVar1 != 0) * 2 + -2;
  }
  else {
    iVar1 = -2;
  }
  return iVar1;
}

Assistant:

int wally_ec_private_key_verify(const unsigned char *priv_key, size_t priv_key_len)
{
    const secp256k1_context *ctx = secp_ctx();

    if (!ctx)
        return WALLY_ENOMEM;

    if (!priv_key || priv_key_len != EC_PRIVATE_KEY_LEN)
        return WALLY_EINVAL;

    return secp256k1_ec_seckey_verify(ctx, priv_key) ? WALLY_OK : WALLY_EINVAL;
}